

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbg.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  ostringstream *this;
  pointer data;
  vector<double,_std::allocator<double>_> *sequence_to_write;
  size_type __n;
  uint uVar7;
  char *pcVar8;
  allocator local_715;
  int num_order;
  int num_iteration;
  int min_num_vector_in_cluster;
  int target_codebook_size;
  int seed;
  StatisticsAccumulation statistics_accumulation;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  input_vectors;
  double splitting_factor;
  double convergence_threshold;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  codebook_vectors;
  vector<int,_std::allocator<int>_> codebook_indices;
  double total_distance;
  ostringstream error_message_10;
  uint auStack_638 [122];
  vector<double,_std::allocator<double>_> tmp_1;
  ifstream ifs;
  byte abStack_2b8 [488];
  LindeBuzoGrayAlgorithm codebook_design;
  
  num_order = 0x19;
  min_num_vector_in_cluster = 1;
  target_codebook_size = 0x100;
  num_iteration = 1000;
  convergence_threshold = 1e-05;
  splitting_factor = 1e-05;
  local_6e0 = (char *)0x0;
  local_6d8 = (char *)0x0;
  local_6d0 = (char *)0x0;
  seed = min_num_vector_in_cluster;
LAB_001036fe:
  iVar5 = ya_getopt_long(argc,argv,"l:m:s:e:C:I:S:n:i:d:r:h",(option *)0x0,(int *)0x0);
  switch(iVar5) {
  case 100:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar4 = sptk::ConvertStringToDouble((string *)&ifs,&convergence_threshold);
    bVar2 = convergence_threshold < 0.0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -d option must be a non-negative number"
                     );
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    goto LAB_001036fe;
  case 0x65:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&target_codebook_size);
    bVar2 = target_codebook_size < 2;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -e option must be greater than 1");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    goto LAB_001036fe;
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x70:
  case 0x71:
switchD_00103724_caseD_66:
    anon_unknown.dwarf_4948::PrintUsage((ostream *)&std::cerr);
    return 1;
  case 0x68:
    anon_unknown.dwarf_4948::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x69:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&num_iteration);
    bVar2 = num_iteration < 1;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -i option must be a positive integer");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    goto LAB_001036fe;
  case 0x6c:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar2 = num_order < 1;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    num_order = num_order + -1;
    goto LAB_001036fe;
  case 0x6d:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar4 = num_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar2 || bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar6,"non-negative integer");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    goto LAB_001036fe;
  case 0x6e:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar4 = sptk::ConvertStringToInteger((string *)&ifs,&min_num_vector_in_cluster);
    bVar2 = min_num_vector_in_cluster < 1;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -n option must be a positive integer");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    goto LAB_001036fe;
  case 0x72:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar4 = sptk::ConvertStringToDouble((string *)&ifs,&splitting_factor);
    bVar2 = splitting_factor <= 0.0;
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar4 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -r option must be a positive number");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103e67;
    }
    goto LAB_001036fe;
  case 0x73:
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
    bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&seed);
    std::__cxx11::string::~string((string *)&ifs);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::operator<<((ostream *)&ifs,"The argument for the -s option must be an integer");
      std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
LAB_00103e67:
      std::__cxx11::string::~string((string *)&error_message_10);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
    goto LAB_001036fe;
  }
  if (iVar5 == 0x43) {
    local_6d0 = ya_optarg;
    goto LAB_001036fe;
  }
  if (iVar5 == 0x49) {
    local_6d8 = ya_optarg;
    goto LAB_001036fe;
  }
  if (iVar5 == 0x53) {
    local_6e0 = ya_optarg;
    goto LAB_001036fe;
  }
  if (iVar5 != -1) goto switchD_00103724_caseD_66;
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
    sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
    goto LAB_00103e67;
  }
  if (argc == ya_optind) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = argv[ya_optind];
  }
  bVar2 = sptk::SetBinaryMode();
  this = (ostringstream *)&ifs;
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Cannot set translation mode");
    std::__cxx11::string::string((string *)&error_message_10,"lbg",(allocator *)&tmp_1);
    sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
    goto LAB_00103e67;
  }
  std::ifstream::ifstream(this);
  if ((pcVar8 != (char *)0x0) &&
     (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
     (abStack_2b8[*(long *)(_ifs + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
    poVar6 = std::operator<<((ostream *)&error_message_10,"Cannot open file ");
    std::operator<<(poVar6,pcVar8);
    std::__cxx11::string::string((string *)&tmp_1,"lbg",(allocator *)&codebook_design);
    sptk::PrintErrorMessage((string *)&tmp_1,&error_message_10);
    std::__cxx11::string::~string((string *)&tmp_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
    uVar7 = 1;
    goto LAB_00104496;
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    this = (ostringstream *)&std::cin;
  }
  __n = (long)num_order + 1;
  input_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  input_vectors.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&error_message_10,__n,
             (allocator_type *)&tmp_1);
  while( true ) {
    iVar5 = (int)__n;
    bVar2 = sptk::ReadStream<double>
                      (false,0,0,iVar5,(vector<double,_std::allocator<double>_> *)&error_message_10,
                       (istream *)this,(int *)0x0);
    if (!bVar2) break;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&input_vectors,(value_type *)&error_message_10);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&error_message_10);
  if (input_vectors.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      input_vectors.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 0;
  }
  else {
    codebook_vectors.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    codebook_vectors.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    codebook_vectors.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_6d0 == (char *)0x0) {
      uVar7 = 1;
      sptk::StatisticsAccumulation::StatisticsAccumulation
                (&statistics_accumulation,num_order,1,false,false);
      sptk::StatisticsAccumulation::Buffer::Buffer((Buffer *)&tmp_1);
      data = input_vectors.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (data == input_vectors.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&codebook_indices,__n,
                     (allocator_type *)&error_message_10);
          bVar2 = sptk::StatisticsAccumulation::GetMean
                            (&statistics_accumulation,(Buffer *)&tmp_1,
                             (vector<double,_std::allocator<double>_> *)&codebook_indices);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
            std::operator<<((ostream *)&error_message_10,"Failed to initialize codebook");
            std::__cxx11::string::string
                      ((string *)&codebook_design,"lbg",(allocator *)&total_distance);
            sptk::PrintErrorMessage((string *)&codebook_design,&error_message_10);
            std::__cxx11::string::~string((string *)&codebook_design);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
          }
          else {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back(&codebook_vectors,(value_type *)&codebook_indices);
          }
          uVar7 = (uint)!bVar2;
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&codebook_indices);
          goto LAB_0010423c;
        }
        bVar2 = sptk::StatisticsAccumulation::Run(&statistics_accumulation,data,(Buffer *)&tmp_1);
        data = data + 1;
      } while (bVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
      std::operator<<((ostream *)&error_message_10,"Failed to initialize codebook");
      std::__cxx11::string::string((string *)&codebook_design,"lbg",(allocator *)&codebook_indices);
      sptk::PrintErrorMessage((string *)&codebook_design,&error_message_10);
      std::__cxx11::string::~string((string *)&codebook_design);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
      bVar2 = false;
LAB_0010423c:
      sptk::StatisticsAccumulation::Buffer::~Buffer((Buffer *)&tmp_1);
      if (bVar2 != false) goto LAB_00104251;
    }
    else {
      std::ifstream::ifstream(&error_message_10);
      std::ifstream::open((char *)&error_message_10,(_Ios_Openmode)local_6d0);
      uVar1 = *(uint *)((long)auStack_638 + *(long *)(_error_message_10 + -0x18));
      if ((uVar1 & 5) == 0) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&tmp_1,__n,(allocator_type *)&codebook_design);
        while (bVar2 = sptk::ReadStream<double>
                                 (false,0,0,iVar5,&tmp_1,(istream *)&error_message_10,(int *)0x0),
              bVar2) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back(&codebook_vectors,&tmp_1);
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&tmp_1.super__Vector_base<double,_std::allocator<double>_>);
        uVar7 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_1);
        poVar6 = std::operator<<((ostream *)&tmp_1,"Cannot open file ");
        std::operator<<(poVar6,local_6d0);
        std::__cxx11::string::string
                  ((string *)&codebook_design,"lbg",(allocator *)&statistics_accumulation);
        sptk::PrintErrorMessage((string *)&codebook_design,(ostringstream *)&tmp_1);
        std::__cxx11::string::~string((string *)&codebook_design);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_1);
        uVar7 = 1;
      }
      std::ifstream::~ifstream(&error_message_10);
      if ((uVar1 & 5) == 0) {
LAB_00104251:
        sptk::LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
                  (&codebook_design,num_order,
                   (int)(((long)codebook_vectors.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)codebook_vectors.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18),
                   target_codebook_size,min_num_vector_in_cluster,num_iteration,
                   convergence_threshold,splitting_factor,seed);
        if (codebook_design.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
          std::operator<<((ostream *)&error_message_10,"Failed to initialize LindeBuzoGrayAlgorithm"
                         );
          std::__cxx11::string::string((string *)&tmp_1,"lbg",(allocator *)&statistics_accumulation)
          ;
          sptk::PrintErrorMessage((string *)&tmp_1,&error_message_10);
          std::__cxx11::string::~string((string *)&tmp_1);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
          uVar7 = 1;
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector
                    (&codebook_indices,
                     ((long)input_vectors.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)input_vectors.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                     (allocator_type *)&error_message_10);
          bVar2 = sptk::LindeBuzoGrayAlgorithm::Run
                            (&codebook_design,&input_vectors,&codebook_vectors,&codebook_indices,
                             &total_distance);
          sequence_to_write =
               codebook_vectors.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if (bVar2) {
            while (sequence_to_write !=
                   codebook_vectors.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
              bVar2 = sptk::WriteStream<double>
                                (0,iVar5,sequence_to_write,(ostream *)&std::cout,(int *)0x0);
              sequence_to_write = sequence_to_write + 1;
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
                std::operator<<((ostream *)&error_message_10,"Failed to write codebook vector");
                std::__cxx11::string::string
                          ((string *)&tmp_1,"lbg",(allocator *)&statistics_accumulation);
                sptk::PrintErrorMessage((string *)&tmp_1,&error_message_10);
                goto LAB_00104454;
              }
            }
            if (local_6d8 == (char *)0x0) {
LAB_001045ea:
              if (local_6e0 != (char *)0x0) {
                std::ofstream::ofstream(&error_message_10);
                std::ofstream::open((char *)&error_message_10,(_Ios_Openmode)local_6e0);
                if ((*(byte *)((long)auStack_638 + *(long *)(_error_message_10 + -0x18)) & 5) == 0)
                {
                  bVar4 = sptk::WriteStream<double>(total_distance,(ostream *)&error_message_10);
                  bVar2 = true;
                  if (!bVar4) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_1);
                    std::operator<<((ostream *)&tmp_1,"Failed to write total distance");
                    std::__cxx11::string::string
                              ((string *)&statistics_accumulation,"lbg",&local_715);
                    sptk::PrintErrorMessage
                              ((string *)&statistics_accumulation,(ostringstream *)&tmp_1);
                    goto LAB_001046eb;
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_1);
                  poVar6 = std::operator<<((ostream *)&tmp_1,"Cannot open file ");
                  std::operator<<(poVar6,local_6e0);
                  std::__cxx11::string::string((string *)&statistics_accumulation,"lbg",&local_715);
                  sptk::PrintErrorMessage
                            ((string *)&statistics_accumulation,(ostringstream *)&tmp_1);
LAB_001046eb:
                  std::__cxx11::string::~string((string *)&statistics_accumulation);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_1);
                  uVar7 = 1;
                  bVar2 = false;
                }
                std::ofstream::~ofstream(&error_message_10);
                if (!bVar2) goto LAB_00104472;
              }
              uVar7 = 0;
            }
            else {
              std::ofstream::ofstream(&error_message_10);
              std::ofstream::open((char *)&error_message_10,(_Ios_Openmode)local_6d8);
              if ((*(byte *)((long)auStack_638 + *(long *)(_error_message_10 + -0x18)) & 5) == 0) {
                bVar4 = sptk::WriteStream<int>
                                  (0,(int)((ulong)((long)codebook_indices.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)codebook_indices.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2),
                                   &codebook_indices,(ostream *)&error_message_10,(int *)0x0);
                bVar2 = true;
                if (!bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_1);
                  std::operator<<((ostream *)&tmp_1,"Failed to write codebook index");
                  std::__cxx11::string::string((string *)&statistics_accumulation,"lbg",&local_715);
                  sptk::PrintErrorMessage
                            ((string *)&statistics_accumulation,(ostringstream *)&tmp_1);
                  goto LAB_001045b8;
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmp_1);
                poVar6 = std::operator<<((ostream *)&tmp_1,"Cannot open file ");
                std::operator<<(poVar6,local_6d8);
                std::__cxx11::string::string((string *)&statistics_accumulation,"lbg",&local_715);
                sptk::PrintErrorMessage((string *)&statistics_accumulation,(ostringstream *)&tmp_1);
LAB_001045b8:
                std::__cxx11::string::~string((string *)&statistics_accumulation);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmp_1);
                uVar7 = 1;
                bVar2 = false;
              }
              std::ofstream::~ofstream(&error_message_10);
              if (bVar2) goto LAB_001045ea;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
            std::operator<<((ostream *)&error_message_10,"Failed to design codebook");
            std::__cxx11::string::string
                      ((string *)&tmp_1,"lbg",(allocator *)&statistics_accumulation);
            sptk::PrintErrorMessage((string *)&tmp_1,&error_message_10);
LAB_00104454:
            std::__cxx11::string::~string((string *)&tmp_1);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
            uVar7 = 1;
          }
LAB_00104472:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&codebook_indices.super__Vector_base<int,_std::allocator<int>_>);
        }
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&codebook_vectors);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&input_vectors);
LAB_00104496:
  std::ifstream::~ifstream(&ifs);
  return uVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int seed(kDefaultSeed);
  int target_codebook_size(kDefaultTargetCodebookSize);
  const char* initial_codebook_file(NULL);
  const char* codebook_index_file(NULL);
  const char* total_distance_file(NULL);
  int min_num_vector_in_cluster(kDefaultMinNumVectorInCluster);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double splitting_factor(kDefaultSplittingFactor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:s:e:C:I:S:n:i:d:r:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &seed)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be an integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &target_codebook_size) ||
            target_codebook_size <= 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be greater than 1";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        initial_codebook_file = optarg;
        break;
      }
      case 'I': {
        codebook_index_file = optarg;
        break;
      }
      case 'S': {
        total_distance_file = optarg;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &min_num_vector_in_cluster) ||
            min_num_vector_in_cluster <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -i option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &splitting_factor) ||
            splitting_factor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be a positive number";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int length(num_order + 1);
  std::vector<std::vector<double> > input_vectors;
  {
    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      input_vectors.push_back(tmp);
    }
  }
  if (input_vectors.empty()) return 0;

  std::vector<std::vector<double> > codebook_vectors;
  if (NULL == initial_codebook_file) {
    sptk::StatisticsAccumulation statistics_accumulation(num_order, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    for (std::vector<std::vector<double> >::iterator itr(input_vectors.begin());
         itr != input_vectors.end(); ++itr) {
      if (!statistics_accumulation.Run(*itr, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to initialize codebook";
        sptk::PrintErrorMessage("lbg", error_message);
        return 1;
      }
    }

    std::vector<double> mean(length);
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to initialize codebook";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    codebook_vectors.push_back(mean);
  } else {
    std::ifstream ifs2;
    ifs2.open(initial_codebook_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << initial_codebook_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &ifs2, NULL)) {
      codebook_vectors.push_back(tmp);
    }
  }

  sptk::LindeBuzoGrayAlgorithm codebook_design(
      num_order, static_cast<int>(codebook_vectors.size()),
      target_codebook_size, min_num_vector_in_cluster, num_iteration,
      convergence_threshold, splitting_factor, seed);
  if (!codebook_design.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LindeBuzoGrayAlgorithm";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  double total_distance;
  std::vector<int> codebook_indices(input_vectors.size());
  if (!codebook_design.Run(input_vectors, &codebook_vectors, &codebook_indices,
                           &total_distance)) {
    std::ostringstream error_message;
    error_message << "Failed to design codebook";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  for (std::vector<std::vector<double> >::iterator itr(
           codebook_vectors.begin());
       itr != codebook_vectors.end(); ++itr) {
    if (!sptk::WriteStream(0, length, *itr, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook vector";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  if (NULL != codebook_index_file) {
    std::ofstream ofs;
    ofs.open(codebook_index_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << codebook_index_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(0, static_cast<int>(codebook_indices.size()),
                           codebook_indices, &output_stream, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook index";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  if (NULL != total_distance_file) {
    std::ofstream ofs;
    ofs.open(total_distance_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_distance_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_distance, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total distance";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  return 0;
}